

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageSamplingInstance.cpp
# Opt level: O0

bool vkt::pipeline::anon_unknown_0::validateResultImage<tcu::TextureCubeView>
               (TextureCubeView *texture,Sampler *sampler,VkComponentMapping *swz,
               ConstPixelBufferAccess *texCoords,Vec2 *lodBounds,LookupPrecision *lookupPrecision,
               Vec4 *lookupScale,Vec4 *lookupBias,ConstPixelBufferAccess *result,
               PixelBufferAccess *errorMask)

{
  PtrData<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_> data;
  undefined8 lookupPrecision_00;
  bool bVar1;
  TextureCube *texture_00;
  TextureCube *in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  Vec4 local_9c;
  Vec4 local_8c;
  PtrData<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_> local_70;
  PtrData<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_> *local_60;
  undefined1 local_50 [8];
  UniquePtr<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_> swizzledTex;
  LookupPrecision *lookupPrecision_local;
  Vec2 *lodBounds_local;
  ConstPixelBufferAccess *texCoords_local;
  VkComponentMapping *swz_local;
  Sampler *sampler_local;
  TextureCubeView *texture_local;
  
  swizzledTex.super_UniqueBase<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_>.m_data._8_8_
       = lookupPrecision;
  bVar1 = isIdentitySwizzle(swz);
  if (bVar1) {
    texture_local._7_1_ =
         validateResultImage<tcu::TextureCubeView>
                   (texture,sampler,texCoords,lodBounds,
                    (LookupPrecision *)
                    swizzledTex.
                    super_UniqueBase<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_>.m_data
                    ._8_8_,lookupScale,lookupBias,result,errorMask);
  }
  else {
    createSwizzledCopy<tcu::TextureCubeView>
              ((MovePtr<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_> *)&local_70,texture
               ,swz);
    local_60 = de::details::MovePtr::operator_cast_to_PtrData(&local_70,(MovePtr *)texture);
    data._8_8_ = in_stack_ffffffffffffff10;
    data.ptr = in_stack_ffffffffffffff08;
    de::details::UniquePtr<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_>::UniquePtr
              ((UniquePtr<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_> *)local_50,data);
    de::details::MovePtr<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_>::~MovePtr
              ((MovePtr<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_> *)&local_70);
    texture_00 = de::details::UniqueBase<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_>::
                 operator*((UniqueBase<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_> *)
                           local_50);
    lookupPrecision_00 =
         swizzledTex.super_UniqueBase<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_>.
         m_data._8_8_;
    swizzleScaleBias((anon_unknown_0 *)&local_8c,lookupScale,swz);
    swizzleScaleBias((anon_unknown_0 *)&local_9c,lookupBias,swz);
    texture_local._7_1_ =
         validateResultImage<tcu::TextureCube>
                   (texture_00,sampler,texCoords,lodBounds,(LookupPrecision *)lookupPrecision_00,
                    &local_8c,&local_9c,result,errorMask);
    de::details::UniquePtr<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_>::~UniquePtr
              ((UniquePtr<tcu::TextureCube,_de::DefaultDeleter<tcu::TextureCube>_> *)local_50);
  }
  return texture_local._7_1_;
}

Assistant:

bool validateResultImage (const TextureViewType&				texture,
						  const tcu::Sampler&					sampler,
						  const vk::VkComponentMapping&			swz,
						  const tcu::ConstPixelBufferAccess&	texCoords,
						  const tcu::Vec2&						lodBounds,
						  const tcu::LookupPrecision&			lookupPrecision,
						  const tcu::Vec4&						lookupScale,
						  const tcu::Vec4&						lookupBias,
						  const tcu::ConstPixelBufferAccess&	result,
						  const tcu::PixelBufferAccess&			errorMask)
{
	if (isIdentitySwizzle(swz))
		return validateResultImage(texture, sampler, texCoords, lodBounds, lookupPrecision, lookupScale, lookupBias, result, errorMask);
	else
	{
		// There is (currently) no way to handle swizzling inside validation loop
		// and thus we need to pre-swizzle the texture.
		UniquePtr<typename TexViewTraits<TextureViewType>::TextureType>	swizzledTex	(createSwizzledCopy(texture, swz));

		return validateResultImage(*swizzledTex, sampler, texCoords, lodBounds, lookupPrecision, swizzleScaleBias(lookupScale, swz), swizzleScaleBias(lookupBias, swz), result, errorMask);
	}
}